

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  size_t sVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  char *lhs_expression;
  char *rhs_expression;
  AssertHelper *this_00;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__3;
  StringIO stringio;
  string stringbuf;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char contents [24];
  AssertionResult gtest_ar;
  size_t num_bytes;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  string kExpectedSparse;
  string kExpectedDense;
  TypeParam ht_out;
  _IO_FILE *in_stack_fffffffffffffb08;
  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  allocator_type *in_stack_fffffffffffffb20;
  key_equal *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  size_type in_stack_fffffffffffffb38;
  Type TVar5;
  string *s;
  HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  char *in_stack_fffffffffffffb78;
  char *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  AssertHelper *in_stack_fffffffffffffb90;
  AssertionResult local_3f8 [2];
  AssertionResult local_3d8;
  string local_3c8 [55];
  undefined1 local_391;
  AssertionResult local_390;
  StringIO local_380;
  string local_378;
  allocator local_341;
  string local_340 [32];
  AssertionResult local_320 [2];
  allocator local_2f9;
  string local_2f8 [32];
  AssertionResult local_2d8 [2];
  int local_2b8;
  undefined4 local_2b4;
  AssertionResult local_2b0 [2];
  size_t local_290;
  AssertionResult local_288;
  char local_278 [40];
  undefined8 local_250;
  AssertionResult local_248;
  size_t local_238;
  string local_230 [55];
  undefined1 local_1f9;
  AssertionResult local_1f8;
  string local_1e8 [55];
  undefined1 local_1b1;
  AssertionResult local_1b0;
  string local_1a0 [55];
  undefined1 local_169;
  AssertionResult local_168;
  FILE *local_158;
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [48];
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_f0;
  Hasher local_e0;
  Hasher local_d4;
  HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  local_c8;
  
  Hasher::Hasher(&local_d4,0);
  Hasher::Hasher(&local_e0,0);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::Alloc(&local_f0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             (hasher *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
             in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
  TVar5 = (Type)(in_stack_fffffffffffffb38 >> 0x20);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::~Alloc(&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,anon_var_dwarf_14da82,0x18,&local_121);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"$hu1",0x14,&local_149);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  bVar2 = google::
          HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
          ::supports_readwrite(&local_c8);
  if (bVar2) {
    local_158 = tmpfile();
    local_169 = local_158 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,(bool *)in_stack_fffffffffffffb08,
               (type *)0xfbca06);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_168);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_1a0);
      testing::Message::~Message((Message *)0xfbcb57);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfbcbeb);
    local_1b1 = google::
                BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                ::write_metadata<_IO_FILE>(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,(bool *)in_stack_fffffffffffffb08,
               (type *)0xfbcc32);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_1e8);
      testing::Message::~Message((Message *)0xfbcd07);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfbcd9b);
    local_1f9 = google::
                BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                ::write_nopointer_data<_IO_FILE>
                          (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,(bool *)in_stack_fffffffffffffb08,
               (type *)0xfbcde2);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1f8);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_230);
      testing::Message::~Message((Message *)0xfbceb7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfbcf4e);
    local_238 = ftell(local_158);
    rewind(local_158);
    local_250 = 0x18;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((char *)in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (unsigned_long *)in_stack_fffffffffffffb10);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_248);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::AssertionResult::failure_message((AssertionResult *)0xfbd003);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xfbd066);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfbd0d7);
    local_290 = fread(local_278,1,local_238,local_158);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (unsigned_long *)in_stack_fffffffffffffb10);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_288);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      in_stack_fffffffffffffb90 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xfbd186);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xfbd1e9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfbd25a);
    local_2b4 = 0xffffffff;
    in_stack_fffffffffffffb8c = fgetc(local_158);
    local_2b8 = in_stack_fffffffffffffb8c;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
               (int *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (int *)in_stack_fffffffffffffb10);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      in_stack_fffffffffffffb80 =
           testing::AssertionResult::failure_message((AssertionResult *)0xfbd2fc);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xfbd359);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfbd3ca);
    fclose(local_158);
    in_stack_fffffffffffffb74 = (int)local_278[0];
    in_stack_fffffffffffffb78 = (char *)std::__cxx11::string::operator[]((ulong)local_120);
    sVar1 = local_238;
    if (in_stack_fffffffffffffb74 == *in_stack_fffffffffffffb78) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,local_278,sVar1,&local_2f9);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((char *)in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb40);
        testing::AssertionResult::failure_message((AssertionResult *)0xfbd527);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb40,TVar5,
                   (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                   (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb90,
                   (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
        testing::Message::~Message((Message *)0xfbd584);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfbd5ef);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_340,local_278,sVar1,&local_341);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((char *)in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_320);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb40);
        in_stack_fffffffffffffb40 =
             (HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0xfbd70a);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb40,TVar5,
                   (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                   (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb90,
                   (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
        testing::Message::~Message((Message *)0xfbd767);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfbd7d2);
    }
  }
  iVar4 = (int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
  bVar2 = google::
          HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization(&local_c8);
  if (bVar2) {
    s = &local_378;
    std::__cxx11::string::string((string *)s);
    StringIO::StringIO(&local_380,s);
    TVar5 = (Type)((ulong)s >> 0x20);
    uVar3 = google::
            BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>>
            ::serialize<google::sparsehash_internal::pod_serializer<std::__cxx11::string>,StringIO>
                      (&local_c8.
                        super_BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                       ,&local_380);
    local_391 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,(bool *)in_stack_fffffffffffffb08,
               (type *)0xfbd865);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_390);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,TVar5,
                 (char *)CONCAT17(uVar3,in_stack_fffffffffffffb30),iVar4,
                 (char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_3c8);
      testing::Message::~Message((Message *)0xfbd941);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfbd9d8);
    lhs_expression = (char *)std::__cxx11::string::operator[]((ulong)&local_378);
    iVar4 = (int)*lhs_expression;
    rhs_expression = (char *)std::__cxx11::string::operator[]((ulong)local_120);
    if (iVar4 == *rhs_expression) {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar4,in_stack_fffffffffffffb18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb10);
      iVar4 = (int)((ulong)lhs_expression >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb40);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0xfbda9b);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb40,TVar5,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffffb30),iVar4,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb90,
                   (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xfbdaf8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfbdb63);
    }
    else {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar4,in_stack_fffffffffffffb18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb10);
      iVar4 = (int)((ulong)lhs_expression >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_3f8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb40);
        testing::AssertionResult::failure_message((AssertionResult *)0xfbdbdb);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb40,TVar5,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffffb30),iVar4,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb90,
                   (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
        testing::Message::~Message((Message *)0xfbdc36);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfbdca1);
    }
    std::__cxx11::string::~string((string *)&local_378);
  }
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_120);
  google::
  HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)0xfbdcf7);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, MetadataSerializationAndEndianness) {
  TypeParam ht_out;
  string kExpectedDense(
      "\x13W\x86"
      "B\0\0\0\0\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0",
      24);
  string kExpectedSparse("$hu1\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0", 20);

  if (ht_out.supports_readwrite()) {
    auto fp = tmpfile();
    EXPECT_TRUE(fp != NULL);

    EXPECT_TRUE(ht_out.write_metadata(fp));
    EXPECT_TRUE(ht_out.write_nopointer_data(fp));

    const size_t num_bytes = ftell(fp);
    rewind(fp);
    EXPECT_LE(num_bytes, static_cast<size_t>(24));
    char contents[24];
    EXPECT_EQ(num_bytes, fread(contents, 1, num_bytes, fp));
    EXPECT_EQ(EOF, fgetc(fp));  // check we're *exactly* the right size
    fclose(fp);
    // TODO(csilvers): check type of ht_out instead of looking at the 1st byte.
    if (contents[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, string(contents, num_bytes));
    } else {
      EXPECT_EQ(kExpectedSparse, string(contents, num_bytes));
    }
  }

  // Do it again with new-style serialization.  Here we can use StringIO.
  if (ht_out.supports_serialization()) {
    string stringbuf;
    StringIO stringio(&stringbuf);
    EXPECT_TRUE(
        ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));
    if (stringbuf[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, stringbuf);
    } else {
      EXPECT_EQ(kExpectedSparse, stringbuf);
    }
  }
}